

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

double ddCountPathAux(DdNode *node,st__table *table)

{
  DdNode *pDVar1;
  int iVar2;
  double *value;
  double dVar3;
  double dVar4;
  double dVar5;
  double *dummy;
  double *local_20;
  
  if (node->index == 0x7fffffff) {
    dVar3 = 1.0;
  }
  else {
    iVar2 = st__lookup(table,(char *)node,(char **)&local_20);
    if (iVar2 == 0) {
      pDVar1 = (node->type).kids.E;
      dVar4 = ddCountPathAux((node->type).kids.T,table);
      dVar3 = -1.0;
      if ((dVar4 != -1.0) || (NAN(dVar4))) {
        dVar5 = ddCountPathAux((DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe),table);
        dVar3 = -1.0;
        if ((dVar5 != -1.0) || (NAN(dVar5))) {
          value = (double *)malloc(8);
          if (value != (double *)0x0) {
            *value = dVar4 + dVar5;
            iVar2 = st__add_direct(table,(char *)node,(char *)value);
            if (iVar2 != -10000) {
              return dVar4 + dVar5;
            }
            free(value);
          }
          dVar3 = -1.0;
        }
      }
    }
    else {
      dVar3 = *local_20;
    }
  }
  return dVar3;
}

Assistant:

static double
ddCountPathAux(
  DdNode * node,
  st__table * table)
{

    DdNode      *Nv, *Nnv;
    double      paths, *ppaths, paths1, paths2;
    double      *dummy;


    if (cuddIsConstant(node)) {
        return(1.0);
    }
    if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
        paths = *dummy;
        return(paths);
    }

    Nv = cuddT(node); Nnv = cuddE(node);

    paths1 = ddCountPathAux(Nv,table);
    if (paths1 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths2 = ddCountPathAux(Cudd_Regular(Nnv),table);
    if (paths2 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths = paths1 + paths2;

    ppaths = ABC_ALLOC(double,1);
    if (ppaths == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }

    *ppaths = paths;

    if ( st__add_direct(table,(char *)node, (char *)ppaths) == st__OUT_OF_MEM) {
        ABC_FREE(ppaths);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(paths);

}